

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_testsome_(MPIABI_Fint *incount,MPIABI_Fint *array_of_requests,int *outcount,
                     int *array_of_indices,MPIABI_Fint *array_of_statuses,MPIABI_Fint *ierror)

{
  mpi_testsome_();
  return;
}

Assistant:

void mpiabi_testsome_(
  const MPIABI_Fint * incount,
  MPIABI_Fint * array_of_requests,
  int * outcount,
  int * array_of_indices,
  MPIABI_Fint * array_of_statuses,
  MPIABI_Fint * ierror
) {
  return mpi_testsome_(
    incount,
    array_of_requests,
    outcount,
    array_of_indices,
    array_of_statuses,
    ierror
  );
}